

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_color.h
# Opt level: O0

rgba32 __thiscall xray_re::_color<float>::get(_color<float> *this)

{
  rgba32 rgba;
  float k_max;
  _color<float> *this_local;
  
  return (uint)(long)(this->r * 255.0) |
         (int)(long)(this->a * 255.0) << 0x18 | (int)(long)(this->b * 255.0) << 0x10 |
         (int)(long)(this->g * 255.0) << 8;
}

Assistant:

inline rgba32 _color<T>::get() const
{
	const T k_max = T(255);
	rgba32 rgba = uint32_t(a*k_max) << 24;
	rgba |= uint32_t(b*k_max) << 16;
	rgba |= uint32_t(g*k_max) << 8;
	rgba |= uint32_t(r*k_max);
	return rgba;
}